

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ban.c
# Opt level: O0

void do_ban(CHAR_DATA *ch,char *argument)

{
  bool bVar1;
  int iVar2;
  CHAR_DATA *ch_00;
  CRow *pCVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char *pcVar7;
  tm *__tp;
  long in_RDI;
  CRow row;
  int duration;
  int res;
  int host_type;
  int ban_type;
  BUFFER *buffer;
  char date [4608];
  char arg4 [4608];
  char arg3 [4608];
  char arg2 [4608];
  char arg1 [4608];
  char buf [4608];
  char *in_stack_ffffffffffff9358;
  char *pcVar8;
  undefined4 uVar9;
  char *in_stack_ffffffffffff9360;
  char *this;
  undefined4 uVar10;
  undefined4 in_stack_ffffffffffff9368;
  undefined4 uVar11;
  undefined4 in_stack_ffffffffffff936c;
  char *in_stack_ffffffffffff9370;
  BUFFER *in_stack_ffffffffffff9378;
  char *in_stack_ffffffffffff9380;
  char *__s;
  char *in_stack_ffffffffffff9388;
  CRow local_6c50;
  int local_6c30;
  int local_6c2c;
  undefined4 local_6c28;
  undefined4 local_6c24;
  BUFFER *local_6c20;
  char local_6c18 [4208];
  char local_5a18 [4608];
  char local_4818;
  char local_3618;
  char local_2418 [4608];
  char local_1218 [4608];
  char *in_stack_ffffffffffffffe8;
  
  local_6c24 = 0;
  local_6c28 = 0;
  local_6c30 = 0;
  one_argument(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
  one_argument(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
  one_argument(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
  ch_00 = (CHAR_DATA *)one_argument(in_stack_ffffffffffff9360,in_stack_ffffffffffff9358);
  uVar10 = (undefined4)((ulong)in_stack_ffffffffffff9360 >> 0x20);
  uVar9 = (undefined4)((ulong)in_stack_ffffffffffff9358 >> 0x20);
  if ((local_2418[0] == '\0') ||
     (bVar1 = str_prefix(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380), bVar1)) {
    if ((local_2418[0] == '\0') ||
       (((local_3618 == '\0' || (local_4818 == '\0')) || (local_5a18[0] == '\0')))) {
      do_ban(ch_00,in_stack_ffffffffffffffe8);
      send_to_char(in_stack_ffffffffffff9370,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff936c,in_stack_ffffffffffff9368));
    }
    else {
      bVar1 = str_prefix(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
      if (bVar1) {
        bVar1 = str_prefix(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
        if (bVar1) {
          do_ban(ch_00,in_stack_ffffffffffffffe8);
          return;
        }
        local_6c28 = 0;
      }
      else {
        local_6c28 = 1;
      }
      bVar1 = str_prefix(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
      if (bVar1) {
        bVar1 = str_prefix(in_stack_ffffffffffff9388,in_stack_ffffffffffff9380);
        if (bVar1) {
          do_ban(ch_00,in_stack_ffffffffffffffe8);
          return;
        }
        local_6c24 = 1;
      }
      else {
        local_6c24 = 0;
      }
      local_6c30 = atoi(local_5a18);
      pcVar8 = local_6c18;
      __tp = localtime(&current_time);
      strftime(pcVar8,200,"%Y-%m-%d",__tp);
      uVar11 = local_6c28;
      local_6c2c = CSQLInterface::Insert
                             (&RS.SQL,"bans VALUES(\'%s\',\'%s\',\'%s\',\'%s\',%d,%d,%d)",local_2418
                              ,*(undefined8 *)(in_RDI + 0xf0),ch_00,local_6c18,
                              CONCAT44(uVar9,local_6c30),CONCAT44(uVar10,local_6c24));
      if (local_6c2c == 0) {
        send_to_char(in_stack_ffffffffffff9370,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff936c,uVar11));
      }
      else {
        send_to_char(in_stack_ffffffffffff9370,
                     (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff936c,uVar11));
      }
    }
  }
  else {
    local_6c2c = CSQLInterface::Select
                           (&RS.SQL,
                            "bans.*,DATE_FORMAT(date,\'%%m/%%d/%%Y\') FROM bans ORDER BY duration DESC"
                           );
    if (local_6c2c == 0) {
      send_to_char(in_stack_ffffffffffff9370,
                   (CHAR_DATA *)CONCAT44(in_stack_ffffffffffff936c,in_stack_ffffffffffff9368));
    }
    else {
      local_6c20 = new_buf();
      pcVar8 = "Duration";
      this = "Reason";
      sprintf(local_1218,"%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r","Site","By","Type","Date");
      add_buf(in_stack_ffffffffffff9378,in_stack_ffffffffffff9370);
      while (bVar1 = CSQLInterface::End(&RS.SQL), ((bVar1 ^ 0xffU) & 1) != 0) {
        pCVar3 = CSQLInterface::GetRow((CSQLInterface *)this);
        local_6c50.maxcol = pCVar3->maxcol;
        local_6c50.maxrow = pCVar3->maxrow;
        local_6c50.rowpos = pCVar3->rowpos;
        local_6c50.row = pCVar3->row;
        __s = local_1218;
        pcVar4 = CRow::operator[](&local_6c50,0);
        pcVar5 = CRow::operator[](&local_6c50,1);
        pcVar8 = CRow::operator[](&local_6c50,5);
        iVar2 = atoi(pcVar8);
        pcVar6 = "All";
        if (0 < iVar2) {
          pcVar6 = "Newbie";
        }
        pcVar7 = CRow::operator[](&local_6c50,7);
        pcVar8 = CRow::operator[](&local_6c50,4);
        this = CRow::operator[](&local_6c50,2);
        sprintf(__s,"%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r",pcVar4,pcVar5,pcVar6,pcVar7);
        add_buf(in_stack_ffffffffffff9378,in_stack_ffffffffffff9370);
      }
      buf_string(local_6c20);
      page_to_char(this,(CHAR_DATA *)pcVar8);
      free_buf((BUFFER *)0x5a4bac);
    }
  }
  return;
}

Assistant:

void do_ban(CHAR_DATA *ch, char *argument)
{
	//TODO: This is function really needs to be two functions. One to perform bans and the other to list bans.

	char buf[MSL];
	char arg1[MSL], arg2[MSL], arg3[MSL], arg4[MSL], date[MSL];
	BUFFER *buffer;
	int ban_type = 0, host_type = 0, res, duration = 0;

	argument = one_argument(argument, arg1);
	argument = one_argument(argument, arg2);
	argument = one_argument(argument, arg3);
	argument = one_argument(argument, arg4);

	if (arg1[0] != '\0' && !str_prefix(arg1, "show"))
	{
		res = RS.SQL.Select("bans.*,DATE_FORMAT(date,\'%%m/%%d/%%Y\') FROM bans ORDER BY duration DESC");

		if (res)
		{
			buffer = new_buf();

			sprintf(buf, "%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r", "Site", "By", "Type", "Date", "Duration", "Reason");
			add_buf(buffer, buf);

			while (!RS.SQL.End())
			{
				auto row = RS.SQL.GetRow();

				sprintf(buf, "%-25s\t%-10s\t%-10s\t%-10s\t%-10s\t%-10s\n\r",
					row[0],
					row[1],
					(atoi(row[5]) > 0) ? "Newbie" : "All",
					row[7],
					row[4],
					row[2]);

				add_buf(buffer, buf);
			}

			page_to_char(buf_string(buffer), ch);
			free_buf(buffer);
		}
		else
		{
			send_to_char("There are no current bans placed.\n\r", ch);
		}

		return;
	}

	if (arg1[0] == '\0' || arg2[0] == '\0' || arg3[0] == '\0' || arg4[0] == '\0')
	{
		do_ban(ch, "show");
		send_to_char("Syntax:    ban <site> <ip/host> <newbie/all> <duration> <reason>    (-1 duration is permanent)\n\r           unban <site>\n\r           ban show\n\r", ch);
		return;
	}

	if (!str_prefix(arg2, "ip"))
	{
		host_type = NBAN_IP;
	}
	else if (!str_prefix(arg2, "host"))
	{
		host_type = NBAN_HOST;
	}
	else
	{
		do_ban(ch, "");
		return;
	}

	if (!str_prefix(arg3, "all"))
	{
		ban_type = NBAN_ALL;
	}
	else if (!str_prefix(arg3, "newbie"))
	{
		ban_type = NBAN_NEWBIE;
	}
	else
	{
		do_ban(ch, "");
		return;
	}

	duration = atoi(arg4);

	strftime(date, 200, "%Y-%m-%d", localtime(&current_time));

	res = RS.SQL.Insert("bans VALUES(\'%s\',\'%s\',\'%s\',\'%s\',%d,%d,%d)", arg1, ch->true_name, argument, date, duration, ban_type, host_type);
	if (res)
	{
		send_to_char("Ban added.\n\r", ch);
		return;
	}
	else
	{
		send_to_char("Ban failed, error..yell at Morglum.\n\r", ch);
		return;
	}
}